

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * __thiscall google::protobuf::FastInt32ToBufferLeft(protobuf *this,int32 i,char *buffer)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  byte *pbVar5;
  undefined4 in_register_00000034;
  uint uVar6;
  
  uVar6 = (uint)this;
  pbVar5 = (byte *)CONCAT44(in_register_00000034,i);
  if ((int)uVar6 < 0) {
    *pbVar5 = 0x2d;
    pcVar4 = FastUInt32ToBufferLeft((protobuf *)(ulong)-uVar6,i + 1,buffer);
    return pcVar4;
  }
  if (uVar6 < 1000000000) {
    if (99 < uVar6) {
      if (9999 < uVar6) {
        if (999999 < uVar6) {
          if (99999999 < uVar6) {
            uVar1 = ((ulong)this & 0xffffffff) / 100000000;
            iVar2 = (int)uVar1;
            *pbVar5 = (byte)uVar1 | 0x30;
            pbVar5 = pbVar5 + 1;
            goto LAB_00348343;
          }
          if (9999999 < uVar6) goto LAB_0034834b;
          uVar1 = ((ulong)this & 0xffffffff) / 1000000;
          iVar2 = (int)uVar1;
          *pbVar5 = (char)uVar1 + 0x30;
          pbVar5 = pbVar5 + 1;
          goto LAB_00348368;
        }
        if (99999 < uVar6) goto LAB_00348370;
        uVar1 = ((ulong)this & 0xffffffff) / 10000;
        iVar2 = (int)uVar1;
        *pbVar5 = (byte)uVar1 | 0x30;
        pbVar5 = pbVar5 + 1;
        goto LAB_0034838d;
      }
      if (999 < uVar6) goto LAB_00348395;
      uVar3 = (ushort)this / 100;
      *pbVar5 = (byte)uVar3 | 0x30;
      pbVar5 = pbVar5 + 1;
      goto LAB_003483b0;
    }
    if (uVar6 < 10) {
      *pbVar5 = (byte)this | 0x30;
      pbVar5 = pbVar5 + 1;
      goto LAB_003483c9;
    }
  }
  else {
    uVar1 = ((ulong)this & 0xffffffff) / 100000000;
    iVar2 = (int)uVar1;
    *(undefined2 *)pbVar5 = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
    pbVar5 = pbVar5 + 2;
LAB_00348343:
    this = (protobuf *)(ulong)(uVar6 + iVar2 * -100000000);
LAB_0034834b:
    uVar6 = (uint)this;
    uVar1 = ((ulong)this & 0xffffffff) / 1000000;
    iVar2 = (int)uVar1;
    *(undefined2 *)pbVar5 = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
    pbVar5 = pbVar5 + 2;
LAB_00348368:
    this = (protobuf *)(ulong)(uVar6 + iVar2 * -1000000);
LAB_00348370:
    uVar6 = (uint)this;
    uVar1 = ((ulong)this & 0xffffffff) / 10000;
    iVar2 = (int)uVar1;
    *(undefined2 *)pbVar5 = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
    pbVar5 = pbVar5 + 2;
LAB_0034838d:
    this = (protobuf *)(ulong)(uVar6 + iVar2 * -10000);
LAB_00348395:
    uVar6 = (uint)this;
    uVar1 = ((ulong)this & 0xffffffff) / 100;
    uVar3 = (uint)uVar1;
    *(undefined2 *)pbVar5 = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
    pbVar5 = pbVar5 + 2;
LAB_003483b0:
    this = (protobuf *)(ulong)(uVar6 + uVar3 * -100);
  }
  *(undefined2 *)pbVar5 = *(undefined2 *)(two_ASCII_digits + ((ulong)this & 0xffffffff) * 2);
  pbVar5 = pbVar5 + 2;
LAB_003483c9:
  *pbVar5 = 0;
  return (char *)pbVar5;
}

Assistant:

char* FastInt32ToBufferLeft(int32 i, char* buffer) {
  uint32 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt32ToBufferLeft(u, buffer);
}